

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::TPZManVector
          (TPZManVector<TPZEqnArray<long_double>,_10> *this,
          TPZManVector<TPZEqnArray<long_double>,_10> *copy)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  TPZEqnArray<long_double> *pTVar3;
  TPZEqnArray<long_double> *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = (TPZEqnArray<long_double> *)0x0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = 0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_017c3b68;
  pTVar4 = (TPZEqnArray<long_double> *)&this->field_0x20;
  lVar5 = 0;
  pTVar3 = pTVar4;
  do {
    TPZEqnArray<long_double>::TPZEqnArray(pTVar3);
    lVar5 = lVar5 + -0x51e0;
    pTVar3 = pTVar3 + 1;
  } while (lVar5 != -0x332c0);
  uVar7 = (copy->super_TPZVec<TPZEqnArray<long_double>_>).fNElements;
  if ((long)uVar7 < 0xb) {
    uVar6 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x51e0),8) == 0) {
      uVar6 = SUB168(auVar1 * ZEXT816(0x51e0),0) | 0x10;
    }
    pvVar2 = operator_new__(uVar6);
    *(ulong *)((long)pvVar2 + 8) = uVar7;
    pTVar4 = (TPZEqnArray<long_double> *)((long)pvVar2 + 0x10);
    lVar5 = 0;
    pTVar3 = pTVar4;
    do {
      TPZEqnArray<long_double>::TPZEqnArray(pTVar3);
      lVar5 = lVar5 + -0x51e0;
      pTVar3 = pTVar3 + 1;
      uVar6 = uVar7;
    } while (uVar7 * -0x51e0 - lVar5 != 0);
  }
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = pTVar4;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = uVar7;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = uVar6;
  uVar6 = 0;
  if ((long)uVar7 < 1) {
    uVar7 = uVar6;
  }
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    TPZEqnArray<long_double>::operator=
              ((TPZEqnArray<long_double> *)
               ((long)(((this->super_TPZVec<TPZEqnArray<long_double>_>).fStore)->fEqStart).
                      super_TPZManVector<int,_100>.fExtAlloc + (uVar6 - 0x28)),
               (TPZEqnArray<long_double> *)
               ((long)(((copy->super_TPZVec<TPZEqnArray<long_double>_>).fStore)->fEqStart).
                      super_TPZManVector<int,_100>.fExtAlloc + (uVar6 - 0x28)));
    uVar6 = uVar6 + 0x51e0;
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}